

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O3

matrix2d * __thiscall tinyusdz::value::matrix2d::operator=(matrix2d *this,matrix2f *src)

{
  float afVar1 [2];
  
  afVar1 = src->m[0];
  this->m[0][0] = (double)afVar1[0];
  this->m[0][1] = (double)afVar1[1];
  afVar1 = src->m[1];
  this->m[1][0] = (double)afVar1[0];
  this->m[1][1] = (double)afVar1[1];
  return this;
}

Assistant:

matrix2d &matrix2d::operator=(const matrix2f &src) {

  for (size_t j = 0; j < 2; j++) {
    for (size_t i = 0; i < 2; i++) {
      m[j][i] = double(src.m[j][i]);
    }
  }

  return *this;
}